

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManMappingVerify_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
LAB_00213d78:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar10 = ((long)pObj - (long)pGVar1 >> 2) * -0x5555555555555555;
  uVar9 = (uint)uVar10;
  if (p->nTravIdsAlloc <= (int)uVar9) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar4 = 1;
  if (p->pTravIds[(int)uVar9] != p->nTravIds) {
    p->pTravIds[(int)uVar9] = p->nTravIds;
    uVar5 = (uint)*(undefined8 *)pObj;
    if (((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) &&
       ((((uint)((ulong)*(undefined8 *)pObj >> 0x20) ^ uVar5) & 0x1fffffff) != 0)) {
      if (pObj < pGVar1 + p->nObjs) {
        if ((-1 < (int)uVar9) && ((int)uVar9 < p->vMapping->nSize)) {
          if (p->vMapping->pArray[uVar9 & 0x7fffffff] == 0) {
            Abc_Print(-1,"Gia_ManMappingVerify: Internal node %d does not have mapping.\n",
                      uVar10 & 0xffffffff);
            return 0;
          }
          pVVar6 = p->vMapping;
          iVar3 = pVVar6->nSize;
          if ((int)uVar9 < iVar3) {
            lVar8 = 0;
            do {
              piVar2 = pVVar6->pArray;
              lVar7 = (long)piVar2[uVar9 & 0x7fffffff];
              if ((lVar7 < 0) || (iVar3 <= piVar2[uVar9 & 0x7fffffff])) break;
              if (piVar2[lVar7] <= lVar8) {
                return iVar4;
              }
              if (iVar4 == 0) {
                iVar4 = 0;
              }
              else {
                iVar4 = piVar2[lVar7 + lVar8 + 1];
                if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                iVar4 = Gia_ManMappingVerify_rec(p,p->pObjs + iVar4);
              }
              lVar8 = lVar8 + 1;
              pVVar6 = p->vMapping;
              iVar3 = pVVar6->nSize;
            } while ((int)uVar9 < iVar3);
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      goto LAB_00213d78;
    }
  }
  return 1;
}

Assistant:

int Gia_ManMappingVerify_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Id, iFan, k, Result = 1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( !Gia_ObjIsAndNotBuf(pObj) )
        return 1;
    if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pObj)) )
    {
        Abc_Print( -1, "Gia_ManMappingVerify: Internal node %d does not have mapping.\n", Gia_ObjId(p, pObj) );
        return 0;
    }
    Id = Gia_ObjId(p, pObj);
    Gia_LutForEachFanin( p, Id, iFan, k )
        if ( Result )
            Result &= Gia_ManMappingVerify_rec( p, Gia_ManObj(p, iFan) );
    return Result;
}